

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NearestNeighborsIndex::MergeFrom
          (NearestNeighborsIndex *this,NearestNeighborsIndex *from)

{
  void *pvVar1;
  LogMessage *other;
  LinearIndex *this_00;
  SingleKdTreeIndex *this_01;
  SquaredEuclideanDistance *this_02;
  LinearIndex *from_00;
  SingleKdTreeIndex *from_01;
  SquaredEuclideanDistance *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NearestNeighbors.pb.cc"
               ,0x5a7);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
            (&(this->floatsamples_).super_RepeatedPtrFieldBase,
             &(from->floatsamples_).super_RepeatedPtrFieldBase);
  if (from->numberofdimensions_ != 0) {
    this->numberofdimensions_ = from->numberofdimensions_;
  }
  if (from->_oneof_case_[0] == 0x6e) {
    if (this->_oneof_case_[0] == 0x6e) {
      this_01 = (this->IndexType_).singlekdtreeindex_;
LAB_001dcd54:
      from_01 = (from->IndexType_).singlekdtreeindex_;
    }
    else {
      clear_IndexType(this);
      this->_oneof_case_[0] = 0x6e;
      this_01 = (SingleKdTreeIndex *)operator_new(0x18);
      SingleKdTreeIndex::SingleKdTreeIndex(this_01);
      (this->IndexType_).singlekdtreeindex_ = this_01;
      if (from->_oneof_case_[0] == 0x6e) goto LAB_001dcd54;
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_01 = (SingleKdTreeIndex *)&_SingleKdTreeIndex_default_instance_;
    }
    SingleKdTreeIndex::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    if (this->_oneof_case_[0] == 100) {
      this_00 = (this->IndexType_).linearindex_;
LAB_001dcd1f:
      from_00 = (from->IndexType_).linearindex_;
    }
    else {
      clear_IndexType(this);
      this->_oneof_case_[0] = 100;
      this_00 = (LinearIndex *)operator_new(0x18);
      LinearIndex::LinearIndex(this_00);
      (this->IndexType_).linearindex_ = this_00;
      if (from->_oneof_case_[0] == 100) goto LAB_001dcd1f;
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_00 = (LinearIndex *)&_LinearIndex_default_instance_;
    }
    LinearIndex::MergeFrom(this_00,from_00);
  }
  if (from->_oneof_case_[1] != 200) {
    return;
  }
  if (this->_oneof_case_[1] == 200) {
    this_02 = (this->DistanceFunction_).squaredeuclideandistance_;
  }
  else {
    this->_oneof_case_[1] = 200;
    this_02 = (SquaredEuclideanDistance *)operator_new(0x18);
    SquaredEuclideanDistance::SquaredEuclideanDistance(this_02);
    (this->DistanceFunction_).squaredeuclideandistance_ = this_02;
    if (from->_oneof_case_[1] != 200) {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_02 = (SquaredEuclideanDistance *)&_SquaredEuclideanDistance_default_instance_;
      goto LAB_001dcdd9;
    }
  }
  from_02 = (from->DistanceFunction_).squaredeuclideandistance_;
LAB_001dcdd9:
  SquaredEuclideanDistance::MergeFrom(this_02,from_02);
  return;
}

Assistant:

void NearestNeighborsIndex::MergeFrom(const NearestNeighborsIndex& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NearestNeighborsIndex)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  floatsamples_.MergeFrom(from.floatsamples_);
  if (from.numberofdimensions() != 0) {
    set_numberofdimensions(from.numberofdimensions());
  }
  switch (from.IndexType_case()) {
    case kLinearIndex: {
      mutable_linearindex()->::CoreML::Specification::LinearIndex::MergeFrom(from.linearindex());
      break;
    }
    case kSingleKdTreeIndex: {
      mutable_singlekdtreeindex()->::CoreML::Specification::SingleKdTreeIndex::MergeFrom(from.singlekdtreeindex());
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.DistanceFunction_case()) {
    case kSquaredEuclideanDistance: {
      mutable_squaredeuclideandistance()->::CoreML::Specification::SquaredEuclideanDistance::MergeFrom(from.squaredeuclideandistance());
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
}